

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O1

void __thiscall duckdb::CTableFunctionInfo::~CTableFunctionInfo(CTableFunctionInfo *this)

{
  (this->super_TableFunctionInfo)._vptr_TableFunctionInfo =
       (_func_int **)&PTR__CTableFunctionInfo_024aa958;
  if ((this->extra_info != (void *)0x0) && (this->delete_callback != (duckdb_delete_callback_t)0x0))
  {
    (*this->delete_callback)(this->extra_info);
  }
  this->extra_info = (void *)0x0;
  this->delete_callback = (duckdb_delete_callback_t)0x0;
  TableFunctionInfo::~TableFunctionInfo(&this->super_TableFunctionInfo);
  return;
}

Assistant:

~CTableFunctionInfo() override {
		if (extra_info && delete_callback) {
			delete_callback(extra_info);
		}
		extra_info = nullptr;
		delete_callback = nullptr;
	}